

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearDriveline::ArchiveOUT
          (ChLinkMotorLinearDriveline *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorLinearDriveline>(marchive);
  ChLinkMotorLinear::ArchiveOUT(&this->super_ChLinkMotorLinear,marchive);
  local_38._value = (ChVector<double> *)&(this->super_ChLinkMotorLinear).field_0x278;
  local_38._name = "innershaft1lin";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaft>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaft>_> *)&local_38);
  local_38._value = (ChVector<double> *)&this->innershaft2lin;
  local_38._name = "innershaft2lin";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaft>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaft>_> *)&local_38);
  local_38._value = (ChVector<double> *)&this->innershaft2rot;
  local_38._name = "innershaft2rot";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaft>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaft>_> *)&local_38);
  local_38._value = (ChVector<double> *)&this->innerconstraint1lin;
  local_38._name = "innerconstraint1lin";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaftsBodyTranslation>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBodyTranslation>_> *)&local_38);
  local_38._value = (ChVector<double> *)&this->innerconstraint2lin;
  local_38._name = "innerconstraint2lin";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaftsBodyTranslation>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBodyTranslation>_> *)&local_38);
  local_38._value = (ChVector<double> *)&this->innerconstraint2rot;
  local_38._name = "innerconstraint2rot";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChShaftsBody>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> *)&local_38);
  local_38._value = &this->shaft2_rotation_dir;
  local_38._name = "shaft2_rotation_dir";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorLinearDriveline>();

    // serialize parent class
    ChLinkMotorLinear::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(innershaft1lin);
    marchive << CHNVP(innershaft2lin);
    marchive << CHNVP(innershaft2rot);
    marchive << CHNVP(innerconstraint1lin);
    marchive << CHNVP(innerconstraint2lin);
    marchive << CHNVP(innerconstraint2rot);
    marchive << CHNVP(shaft2_rotation_dir);
}